

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_monitor.cpp
# Opt level: O3

void __thiscall
r_exec::SRMonitor::SRMonitor
          (SRMonitor *this,PrimaryMDLController *controller,BindingMap *bindings,uint64_t sim_thz,
          Fact *goal,Fact *f_imdl)

{
  atomic_int_fast64_t *paVar1;
  TimeJob *this_00;
  _Mem *this_01;
  
  SGMonitor::SGMonitor(&this->super_SGMonitor,controller,bindings,sim_thz,goal,f_imdl);
  (this->super_SGMonitor).super__GMonitor.super_Monitor.super__Object._vptr__Object =
       (_func_int **)&PTR___GMonitor_001bf9e0;
  this_00 = (TimeJob *)operator_new(0x28);
  TimeJob::TimeJob(this_00,sim_thz);
  (this_00->super__Object)._vptr__Object = (_func_int **)&PTR__MonitoringJob_001bfbd8;
  this_00[1].super__Object._vptr__Object = (_func_int **)this;
  LOCK();
  paVar1 = &(this->super_SGMonitor).super__GMonitor.super_Monitor.super__Object.refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  this_01 = (_Mem *)r_code::Mem::Get();
  _Mem::pushTimeJob(this_01,this_00);
  return;
}

Assistant:

SRMonitor::SRMonitor(PrimaryMDLController *controller,
                     BindingMap *bindings,
                     uint64_t sim_thz,
                     Fact *goal,
                     Fact *f_imdl): SGMonitor(controller,
                                 bindings,
                                 sim_thz,
                                 goal,
                                 f_imdl)   // goal is f0->g->f1->object.
{
    MonitoringJob<SRMonitor> *j = new MonitoringJob<SRMonitor>(this, sim_thz);
    _Mem::Get()->pushTimeJob(j);
}